

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::ValueNumberTable::AssignValueNumber(ValueNumberTable *this,Instruction *inst)

{
  spv_operand_type_t t;
  initializer_list<unsigned_int> init_list;
  DecorationManager *pDVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  uint32_t uVar5;
  IRContext *pIVar6;
  mapped_type *pmVar7;
  Operand *pOVar8;
  uint *puVar9;
  pointer ppVar10;
  pointer this_00;
  mapped_type *pmVar11;
  uint32_t local_1b8 [3];
  uint32_t local_1ac;
  _Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true> local_1a8;
  _Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true> local_1a0;
  iterator value_iterator;
  uint local_164;
  iterator local_160;
  undefined8 local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  Operand local_128;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_f8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_f0;
  iterator use_id_to_val;
  uint32_t id_value;
  Operand *op_1;
  undefined1 local_d0 [4];
  uint32_t o;
  undefined1 local_b8 [8];
  Instruction value_ins;
  uint local_40;
  uint32_t local_3c;
  uint32_t op;
  DecorationManager *dec_mgr;
  uint32_t local_28;
  uint32_t local_24;
  Instruction *pIStack_20;
  uint32_t value;
  Instruction *inst_local;
  ValueNumberTable *this_local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  local_24 = GetValueNumber(this,inst);
  this_local._4_4_ = local_24;
  if (local_24 == 0) {
    pIVar6 = context(this);
    bVar2 = IRContext::IsCombinatorInstruction(pIVar6,pIStack_20);
    if ((bVar2) || (bVar2 = opt::Instruction::IsCommonDebugInstr(pIStack_20), bVar2)) {
      OVar4 = opt::Instruction::opcode(pIStack_20);
      if ((OVar4 == OpVariable) || ((OVar4 == OpSampledImage || (OVar4 == OpImage)))) {
        uVar3 = TakeNextValueNumber(this);
        local_24 = uVar3;
        dec_mgr._4_4_ = opt::Instruction::result_id(pIStack_20);
        pmVar7 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->id_to_value_,(key_type *)((long)&dec_mgr + 4));
        *pmVar7 = uVar3;
        this_local._4_4_ = local_24;
      }
      else {
        bVar2 = opt::Instruction::IsLoad(pIStack_20);
        if ((!bVar2) || (bVar2 = opt::Instruction::IsReadOnlyLoad(pIStack_20), bVar2)) {
          pIVar6 = context(this);
          _op = IRContext::get_decoration_mgr(pIVar6);
          OVar4 = opt::Instruction::opcode(pIStack_20);
          pDVar1 = _op;
          if (OVar4 == OpCopyObject) {
            uVar3 = opt::Instruction::result_id(pIStack_20);
            uVar5 = opt::Instruction::GetSingleWordInOperand(pIStack_20,0);
            bVar2 = analysis::DecorationManager::HaveTheSameDecorations(pDVar1,uVar3,uVar5);
            if (bVar2) {
              uVar3 = opt::Instruction::GetSingleWordInOperand(pIStack_20,0);
              uVar3 = GetValueNumber(this,uVar3);
              if (uVar3 != 0) {
                local_24 = uVar3;
                local_3c = opt::Instruction::result_id(pIStack_20);
                pmVar7 = std::
                         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         ::operator[](&this->id_to_value_,&local_3c);
                *pmVar7 = uVar3;
                return local_24;
              }
              local_24 = 0;
            }
          }
          OVar4 = opt::Instruction::opcode(pIStack_20);
          if ((OVar4 == OpPhi) &&
             (uVar3 = opt::Instruction::NumInOperands(pIStack_20), pDVar1 = _op, uVar3 != 0)) {
            uVar3 = opt::Instruction::result_id(pIStack_20);
            uVar5 = opt::Instruction::GetSingleWordInOperand(pIStack_20,0);
            bVar2 = analysis::DecorationManager::HaveTheSameDecorations(pDVar1,uVar3,uVar5);
            if (bVar2) {
              uVar3 = opt::Instruction::GetSingleWordInOperand(pIStack_20,0);
              local_24 = GetValueNumber(this,uVar3);
              if (local_24 != 0) {
                for (local_40 = 2; uVar5 = opt::Instruction::NumInOperands(pIStack_20),
                    uVar3 = local_24, local_40 < uVar5; local_40 = local_40 + 2) {
                  uVar5 = opt::Instruction::GetSingleWordInOperand(pIStack_20,local_40);
                  uVar5 = GetValueNumber(this,uVar5);
                  if (uVar3 != uVar5) {
                    local_24 = 0;
                    break;
                  }
                }
                uVar3 = local_24;
                if (local_24 != 0) {
                  value_ins.dbg_scope_.inlined_at_ = opt::Instruction::result_id(pIStack_20);
                  pmVar7 = std::
                           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           ::operator[](&this->id_to_value_,&value_ins.dbg_scope_.inlined_at_);
                  *pmVar7 = uVar3;
                  return local_24;
                }
              }
            }
          }
          pIVar6 = context(this);
          OVar4 = opt::Instruction::opcode(pIStack_20);
          uVar3 = opt::Instruction::type_id(pIStack_20);
          uVar5 = opt::Instruction::result_id(pIStack_20);
          memset(local_d0,0,0x18);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_d0);
          opt::Instruction::Instruction
                    ((Instruction *)local_b8,pIVar6,OVar4,uVar3,uVar5,(OperandList *)local_d0);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_d0);
          for (op_1._4_4_ = 0; uVar3 = opt::Instruction::NumInOperands(pIStack_20),
              op_1._4_4_ < uVar3; op_1._4_4_ = op_1._4_4_ + 1) {
            pOVar8 = opt::Instruction::GetInOperand(pIStack_20,op_1._4_4_);
            bVar2 = spvIsIdType(pOVar8->type);
            if (bVar2) {
              puVar9 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar8->words,0);
              use_id_to_val.
              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
              _4_4_ = *puVar9;
              local_f0._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::find(&this->id_to_value_,
                          (key_type *)
                          ((long)&use_id_to_val.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 4));
              local_f8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::end(&this->id_to_value_);
              bVar2 = std::__detail::operator!=(&local_f0,&local_f8);
              if (bVar2) {
                ppVar10 = std::__detail::
                          _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                          ::operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                        *)&local_f0);
                use_id_to_val.
                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
                ._4_4_ = ppVar10->second | 0x80000000;
              }
              t = pOVar8->type;
              local_164 = use_id_to_val.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur._4_4_;
              local_160 = &local_164;
              local_158 = 1;
              init_list._M_len = 1;
              init_list._M_array = local_160;
              utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list);
              Operand::Operand(&local_128,t,&local_150);
              opt::Instruction::AddOperand((Instruction *)local_b8,&local_128);
              Operand::~Operand(&local_128);
              utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
            }
            else {
              Operand::Operand((Operand *)&value_iterator,pOVar8->type,&pOVar8->words);
              opt::Instruction::AddOperand((Instruction *)local_b8,(Operand *)&value_iterator);
              Operand::~Operand((Operand *)&value_iterator);
            }
          }
          local_1a0._M_cur =
               (__node_type *)
               std::
               unordered_map<spvtools::opt::Instruction,_unsigned_int,_spvtools::opt::ValueTableHash,_spvtools::opt::ComputeSameValue,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>_>
               ::find(&this->instruction_to_value_,(key_type *)local_b8);
          local_1a8._M_cur =
               (__node_type *)
               std::
               unordered_map<spvtools::opt::Instruction,_unsigned_int,_spvtools::opt::ValueTableHash,_spvtools::opt::ComputeSameValue,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>_>
               ::end(&this->instruction_to_value_);
          bVar2 = std::__detail::operator!=(&local_1a0,&local_1a8);
          if (bVar2) {
            this_00 = std::__detail::
                      _Node_iterator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_false,_true>
                      ::operator->((_Node_iterator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_false,_true>
                                    *)&local_1a0);
            local_1ac = opt::Instruction::result_id(&this_00->first);
            pmVar7 = std::
                     unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::operator[](&this->id_to_value_,&local_1ac);
            uVar3 = *pmVar7;
            local_24 = uVar3;
            local_1b8[2] = opt::Instruction::result_id(pIStack_20);
            pmVar7 = std::
                     unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::operator[](&this->id_to_value_,local_1b8 + 2);
            *pmVar7 = uVar3;
          }
          else {
            uVar5 = TakeNextValueNumber(this);
            local_24 = uVar5;
            local_1b8[0] = opt::Instruction::result_id(pIStack_20);
            pmVar7 = std::
                     unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::operator[](&this->id_to_value_,local_1b8);
            uVar3 = local_24;
            *pmVar7 = uVar5;
            pmVar11 = std::
                      unordered_map<spvtools::opt::Instruction,_unsigned_int,_spvtools::opt::ValueTableHash,_spvtools::opt::ComputeSameValue,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>_>
                      ::operator[](&this->instruction_to_value_,(key_type *)local_b8);
            *pmVar11 = uVar3;
          }
          local_1b8[1] = 1;
          this_local._4_4_ = local_24;
          opt::Instruction::~Instruction((Instruction *)local_b8);
        }
        else {
          uVar3 = TakeNextValueNumber(this);
          local_24 = uVar3;
          dec_mgr._0_4_ = opt::Instruction::result_id(pIStack_20);
          pmVar7 = std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](&this->id_to_value_,(key_type *)&dec_mgr);
          *pmVar7 = uVar3;
          this_local._4_4_ = local_24;
        }
      }
    }
    else {
      uVar3 = TakeNextValueNumber(this);
      local_24 = uVar3;
      local_28 = opt::Instruction::result_id(pIStack_20);
      pmVar7 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->id_to_value_,&local_28);
      *pmVar7 = uVar3;
      this_local._4_4_ = local_24;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ValueNumberTable::AssignValueNumber(Instruction* inst) {
  // If it already has a value return that.
  uint32_t value = GetValueNumber(inst);
  if (value != 0) {
    return value;
  }

  // If the instruction has other side effects, then it must
  // have its own value number.
  // OpSampledImage and OpImage must remain in the same basic block in which
  // they are used, because of this we will assign each one it own value number.
  if (!context()->IsCombinatorInstruction(inst) &&
      !inst->IsCommonDebugInstr()) {
    value = TakeNextValueNumber();
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  switch (inst->opcode()) {
    case spv::Op::OpSampledImage:
    case spv::Op::OpImage:
    case spv::Op::OpVariable:
      value = TakeNextValueNumber();
      id_to_value_[inst->result_id()] = value;
      return value;
    default:
      break;
  }

  // If it is a load from memory that can be modified, we have to assume the
  // memory has been modified, so we give it a new value number.
  //
  // Note that this test will also handle volatile loads because they are not
  // read only.  However, if this is ever relaxed because we analyze stores, we
  // will have to add a new case for volatile loads.
  if (inst->IsLoad() && !inst->IsReadOnlyLoad()) {
    value = TakeNextValueNumber();
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  analysis::DecorationManager* dec_mgr = context()->get_decoration_mgr();

  // When we copy an object, the value numbers should be the same.
  if (inst->opcode() == spv::Op::OpCopyObject &&
      dec_mgr->HaveTheSameDecorations(inst->result_id(),
                                      inst->GetSingleWordInOperand(0))) {
    value = GetValueNumber(inst->GetSingleWordInOperand(0));
    if (value != 0) {
      id_to_value_[inst->result_id()] = value;
      return value;
    }
  }

  // Phi nodes are a type of copy.  If all of the inputs have the same value
  // number, then we can assign the result of the phi the same value number.
  if (inst->opcode() == spv::Op::OpPhi && inst->NumInOperands() > 0 &&
      dec_mgr->HaveTheSameDecorations(inst->result_id(),
                                      inst->GetSingleWordInOperand(0))) {
    value = GetValueNumber(inst->GetSingleWordInOperand(0));
    if (value != 0) {
      for (uint32_t op = 2; op < inst->NumInOperands(); op += 2) {
        if (value != GetValueNumber(inst->GetSingleWordInOperand(op))) {
          value = 0;
          break;
        }
      }
      if (value != 0) {
        id_to_value_[inst->result_id()] = value;
        return value;
      }
    }
  }

  // Replace all of the operands by their value number.  The sign bit will be
  // set to distinguish between an id and a value number.
  Instruction value_ins(context(), inst->opcode(), inst->type_id(),
                        inst->result_id(), {});
  for (uint32_t o = 0; o < inst->NumInOperands(); ++o) {
    const Operand& op = inst->GetInOperand(o);
    if (spvIsIdType(op.type)) {
      uint32_t id_value = op.words[0];
      auto use_id_to_val = id_to_value_.find(id_value);
      if (use_id_to_val != id_to_value_.end()) {
        id_value = (1 << 31) | use_id_to_val->second;
      }
      value_ins.AddOperand(Operand(op.type, {id_value}));
    } else {
      value_ins.AddOperand(Operand(op.type, op.words));
    }
  }

  // TODO: Implement a normal form for opcodes that commute like integer
  // addition.  This will let us know that a+b is the same value as b+a.

  // Otherwise, we check if this value has been computed before.
  auto value_iterator = instruction_to_value_.find(value_ins);
  if (value_iterator != instruction_to_value_.end()) {
    value = id_to_value_[value_iterator->first.result_id()];
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  // If not, assign it a new value number.
  value = TakeNextValueNumber();
  id_to_value_[inst->result_id()] = value;
  instruction_to_value_[value_ins] = value;
  return value;
}